

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

void __thiscall
slang::ast::Compilation::checkBindTargetParams
          (Compilation *this,BindDirectiveSyntax *syntax,Scope *scope,ResolvedBind *resolvedBind)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  size_type sVar3;
  pointer ppSVar4;
  DefinitionSymbol *pDVar5;
  value_type_pointer ppVar6;
  ulong uVar7;
  undefined8 *puVar8;
  int iVar9;
  undefined1 auVar10 [16];
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  SmallVector<const_slang::ast::Symbol_*,_5UL> *__range2;
  undefined8 *puVar16;
  ulong uVar17;
  uchar uVar18;
  uchar uVar19;
  uchar uVar20;
  byte bVar21;
  undefined1 auVar22 [16];
  anon_class_16_2_6b548e5c doCheck;
  anon_class_16_2_6b548e5c local_58;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  sVar3 = (resolvedBind->instTargets).super_SmallVectorBase<const_slang::ast::Symbol_*>.len;
  local_58.syntax = syntax;
  local_58.scope = scope;
  if (sVar3 != 0) {
    ppSVar4 = (resolvedBind->instTargets).super_SmallVectorBase<const_slang::ast::Symbol_*>.data_;
    lVar14 = 0;
    do {
      checkBindTargetParams::anon_class_16_2_6b548e5c::operator()
                (&local_58,*(InstanceBodySymbol **)(*(long *)((long)ppSVar4 + lVar14) + 0x50));
      lVar14 = lVar14 + 8;
    } while (sVar3 << 3 != lVar14);
  }
  pDVar5 = resolvedBind->defTarget;
  if (pDVar5 != (DefinitionSymbol *)0x0) {
    auVar10._8_8_ = 0;
    auVar10._0_8_ = pDVar5;
    uVar12 = SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar11 = uVar12 >> ((byte)(this->instancesWithDefBinds).table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*>_>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*>_>_>_>
                              .arrays.groups_size_index & 0x3f);
    uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[uVar12 & 0xff];
    ppVar6 = (this->instancesWithDefBinds).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*>_>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*>_>_>_>
             .arrays.elements_;
    uVar7 = (this->instancesWithDefBinds).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*>_>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*>_>_>_>
            .arrays.groups_size_mask;
    uVar15 = 0;
    do {
      pgVar1 = (this->instancesWithDefBinds).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*>_>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*>_>_>_>
               .arrays.groups_ + uVar11;
      local_48 = pgVar1->m[0].n;
      uStack_47 = pgVar1->m[1].n;
      uStack_46 = pgVar1->m[2].n;
      bStack_45 = pgVar1->m[3].n;
      uStack_44 = pgVar1->m[4].n;
      uStack_43 = pgVar1->m[5].n;
      uStack_42 = pgVar1->m[6].n;
      bStack_41 = pgVar1->m[7].n;
      uStack_40 = pgVar1->m[8].n;
      uStack_3f = pgVar1->m[9].n;
      uStack_3e = pgVar1->m[10].n;
      bStack_3d = pgVar1->m[0xb].n;
      uStack_3c = pgVar1->m[0xc].n;
      uStack_3b = pgVar1->m[0xd].n;
      uStack_3a = pgVar1->m[0xe].n;
      bStack_39 = pgVar1->m[0xf].n;
      uVar18 = (uchar)uVar2;
      auVar22[0] = -(local_48 == uVar18);
      uVar19 = (uchar)((uint)uVar2 >> 8);
      auVar22[1] = -(uStack_47 == uVar19);
      uVar20 = (uchar)((uint)uVar2 >> 0x10);
      auVar22[2] = -(uStack_46 == uVar20);
      bVar21 = (byte)((uint)uVar2 >> 0x18);
      auVar22[3] = -(bStack_45 == bVar21);
      auVar22[4] = -(uStack_44 == uVar18);
      auVar22[5] = -(uStack_43 == uVar19);
      auVar22[6] = -(uStack_42 == uVar20);
      auVar22[7] = -(bStack_41 == bVar21);
      auVar22[8] = -(uStack_40 == uVar18);
      auVar22[9] = -(uStack_3f == uVar19);
      auVar22[10] = -(uStack_3e == uVar20);
      auVar22[0xb] = -(bStack_3d == bVar21);
      auVar22[0xc] = -(uStack_3c == uVar18);
      auVar22[0xd] = -(uStack_3b == uVar19);
      auVar22[0xe] = -(uStack_3a == uVar20);
      auVar22[0xf] = -(bStack_39 == bVar21);
      for (uVar13 = (uint)(ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe); uVar13 != 0;
          uVar13 = uVar13 - 1 & uVar13) {
        iVar9 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> iVar9 & 1) == 0; iVar9 = iVar9 + 1) {
          }
        }
        uVar17 = (ulong)(uint)(iVar9 << 5);
        if (pDVar5 == *(DefinitionSymbol **)((long)&ppVar6[uVar11 * 0xf].first + uVar17)) {
          puVar8 = *(undefined8 **)
                    ((long)&ppVar6[uVar11 * 0xf].second.
                            super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish + uVar17);
          for (puVar16 = *(undefined8 **)
                          ((long)&ppVar6[uVar11 * 0xf].second.
                                  super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar17);
              puVar16 != puVar8; puVar16 = puVar16 + 1) {
            checkBindTargetParams::anon_class_16_2_6b548e5c::operator()
                      (&local_58,(InstanceBodySymbol *)*puVar16);
          }
          return;
        }
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar12 & 7] & bStack_39) == 0) {
        return;
      }
      lVar14 = uVar11 + uVar15;
      uVar15 = uVar15 + 1;
      uVar11 = lVar14 + 1U & uVar7;
    } while (uVar15 <= uVar7);
  }
  return;
}

Assistant:

void Compilation::checkBindTargetParams(const syntax::BindDirectiveSyntax& syntax,
                                        const Scope& scope, const ResolvedBind& resolvedBind) {
    // This method checks the following rule from the LRM:
    //    User-defined type names that are used to override type parameters must be
    //    visible and matching in both the scope containing the bind statement and in
    //    the target scope.
    auto doCheck = [&](const InstanceBodySymbol& container) {
        if (syntax.instantiation->kind == SyntaxKind::CheckerInstantiation)
            return;

        for (auto instSyntax : syntax.instantiation->as<HierarchyInstantiationSyntax>().instances) {
            if (!instSyntax->decl)
                continue;

            auto sym = container.find(instSyntax->decl->name.valueText());
            if (!sym || sym->kind != SymbolKind::Instance || sym->getSyntax() != instSyntax)
                continue;

            auto& inst = sym->as<InstanceSymbol>();
            for (auto param : inst.body.getParameters()) {
                if (param->symbol.kind == SymbolKind::TypeParameter) {
                    auto& typeParam = param->symbol.as<TypeParameterSymbol>();
                    auto& type = typeParam.targetType.getType();
                    if (typeParam.isOverridden() && type.isAlias() && !type.name.empty()) {
                        // This is the case we need to check; the resolved type is
                        // a named type alias, so we need to also resolve it in the bind
                        // directive scope and make sure they match.
                        auto result = Lookup::unqualified(scope, type.name, LookupFlags::Type);
                        if (!result || !result->isType()) {
                            auto ts = typeParam.getDeclaredType()->getTypeSyntax();
                            SLANG_ASSERT(ts);
                            scope.addDiag(diag::BindTypeParamNotFound, ts->sourceRange())
                                << typeParam.name << type;
                        }
                        else if (!result->as<Type>().isMatching(type)) {
                            auto ts = typeParam.getDeclaredType()->getTypeSyntax();
                            SLANG_ASSERT(ts);
                            scope.addDiag(diag::BindTypeParamMismatch, ts->sourceRange())
                                << typeParam.name << result->as<Type>() << type;
                        }
                    }
                }
            }
        }
    };

    for (auto target : resolvedBind.instTargets)
        doCheck(target->as<InstanceSymbol>().body);

    if (resolvedBind.defTarget) {
        auto it = instancesWithDefBinds.find(resolvedBind.defTarget);
        if (it != instancesWithDefBinds.end()) {
            for (auto target : it->second)
                doCheck(target->as<InstanceBodySymbol>());
        }
    }
}